

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool ON_Font::EqualStretch(ON_Font *lhs,ON_Font *rhs,bool bUnsetIsEqual)

{
  bool bUnsetIsEqual_local;
  ON_Font *rhs_local;
  ON_Font *lhs_local;
  
  if ((lhs == (ON_Font *)0x0) || (rhs == (ON_Font *)0x0)) {
    return false;
  }
  if (lhs->m_font_stretch != rhs->m_font_stretch) {
    if (!bUnsetIsEqual) {
      return false;
    }
    if ((lhs->m_font_stretch != Unset) && (rhs->m_font_stretch != Unset)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ON_Font::EqualStretch(
  const ON_Font* lhs,
  const ON_Font* rhs,
  bool bUnsetIsEqual
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs->m_font_stretch != rhs->m_font_stretch)
  {
    if (false == bUnsetIsEqual)
      return false;
    if (ON_Font::Stretch::Unset != lhs->m_font_stretch && ON_Font::Stretch::Unset != rhs->m_font_stretch)
      return false;
  }
  return true;
}